

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdumpDisassemble::OnLocalDecl
          (BinaryReaderObjdumpDisassemble *this,Index decl_index,Index count,Type type)

{
  char *pcVar1;
  undefined4 in_register_00000014;
  ulong uVar2;
  Offset OVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  Offset OVar7;
  Type local_44;
  Offset local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000014,count);
  OVar3 = this->current_opcode_offset;
  OVar7 = ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.super_BinaryReaderDelegate.
          state)->offset;
  local_44.enum_ = type.enum_;
  printf(" %06zx:",OVar3);
  uVar2 = OVar7 - OVar3;
  local_40 = OVar7;
  if (uVar2 != 0) {
    uVar5 = 9;
    if (uVar2 < 9) {
      uVar5 = uVar2;
    }
    lVar6 = uVar5 + (uVar5 == 0);
    OVar7 = OVar3;
    do {
      printf(" %02x",(ulong)(this->super_BinaryReaderObjdumpBase).data_[OVar7]);
      OVar7 = OVar7 + 1;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  if (uVar2 < 9) {
    lVar6 = (OVar3 - local_40) + 9;
    do {
      printf("   ");
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  printf(" | local[%u",(ulong)this->local_index_);
  iVar4 = (int)local_38;
  if (iVar4 != 1) {
    printf("..%u",(ulong)((iVar4 + this->local_index_) - 1));
  }
  this->local_index_ = this->local_index_ + iVar4;
  pcVar1 = Type::GetName(&local_44);
  printf("] type=%s\n",pcVar1);
  OVar3 = uVar2 + this->current_opcode_offset;
  this->last_opcode_end = OVar3;
  this->current_opcode_offset = OVar3;
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnLocalDecl(Index decl_index,
                                                   Index count,
                                                   Type type) {
  Offset offset = current_opcode_offset;
  size_t data_size = state->offset - offset;

  printf(" %06" PRIzx ":", offset);
  for (size_t i = 0; i < data_size && i < IMMEDIATE_OCTET_COUNT;
       i++, offset++) {
    printf(" %02x", data_[offset]);
  }
  for (size_t i = data_size; i < IMMEDIATE_OCTET_COUNT; i++) {
    printf("   ");
  }
  printf(" | local[%" PRIindex, local_index_);

  if (count != 1) {
    printf("..%" PRIindex "", local_index_ + count - 1);
  }
  local_index_ += count;

  printf("] type=%s\n", type.GetName());

  last_opcode_end = current_opcode_offset + data_size;
  current_opcode_offset = last_opcode_end;

  return Result::Ok;
}